

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_parameters.cpp
# Opt level: O1

string_view_type __thiscall
jessilib::app_parameters::get_value
          (app_parameters *this,string_view_type in_key,string_view_type in_default)

{
  const_iterator cVar1;
  const_iterator cVar2;
  size_t sVar3;
  char8_t *pcVar4;
  string_view_type sVar5;
  key_type local_38;
  key_type local_28;
  
  pcVar4 = in_default._M_str;
  sVar3 = in_default._M_len;
  local_38._M_str = in_key._M_str;
  local_38._M_len = in_key._M_len;
  cVar1 = std::
          _Hashtable<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->m_arg_values)._M_h,&local_38);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    local_28._M_len = local_38._M_len;
    local_28._M_str = local_38._M_str;
    cVar2 = std::
            _Hashtable<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->m_env_values)._M_h,&local_28);
    if (cVar2.
        super__Node_iterator_base<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      sVar3 = *(size_t *)
               ((long)cVar2.
                      super__Node_iterator_base<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_true>
                      ._M_cur + 0x18);
      pcVar4 = *(char8_t **)
                ((long)cVar2.
                       super__Node_iterator_base<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_true>
                       ._M_cur + 0x20);
    }
  }
  else {
    pcVar4 = *(char8_t **)
              ((long)cVar1.
                     super__Node_iterator_base<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_true>
                     ._M_cur + 0x18);
    sVar3 = *(size_t *)
             ((long)cVar1.
                    super__Node_iterator_base<std::pair<const_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_true>
                    ._M_cur + 0x20);
  }
  sVar5._M_str = pcVar4;
  sVar5._M_len = sVar3;
  return sVar5;
}

Assistant:

app_parameters::string_view_type app_parameters::get_value(string_view_type in_key, string_view_type in_default) const {
	// Try args first
	auto result = m_arg_values.find(in_key);
	if (result != m_arg_values.end()) {
		return result->second;
	}

	// Fallback to trying env
	return get_env_value(in_key, in_default);
}